

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

int lj_tab_next(lua_State *L,GCtab *t,TValue *key)

{
  double *pdVar1;
  double *in_RDX;
  long in_RSI;
  cTValue *in_RDI;
  Node *n;
  uint32_t i;
  uint local_7c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  lua_State *in_stack_ffffffffffffffa8;
  
  local_7c = keyindex(in_stack_ffffffffffffffa8,
                      (GCtab *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI)
  ;
  do {
    local_7c = local_7c + 1;
    if (*(uint *)(in_RSI + 0x18) <= local_7c) {
      local_7c = local_7c - *(int *)(in_RSI + 0x18);
      while( true ) {
        if (*(uint *)(in_RSI + 0x1c) < local_7c) {
          return 0;
        }
        pdVar1 = (double *)((ulong)*(uint *)(in_RSI + 0x14) + (ulong)local_7c * 0x18);
        if (*(int *)((long)pdVar1 + 4) != -1) break;
        local_7c = local_7c + 1;
      }
      *in_RDX = pdVar1[1];
      in_RDX[1] = *pdVar1;
      return 1;
    }
  } while (*(int *)((ulong)*(uint *)(in_RSI + 8) + 4 + (ulong)local_7c * 8) == -1);
  *in_RDX = (double)(int)local_7c;
  in_RDX[1] = *(double *)((ulong)*(uint *)(in_RSI + 8) + (ulong)local_7c * 8);
  return 1;
}

Assistant:

int lj_tab_next(lua_State *L, GCtab *t, TValue *key)
{
  uint32_t i = keyindex(L, t, key);  /* Find predecessor key index. */
  for (i++; i < t->asize; i++)  /* First traverse the array keys. */
    if (!tvisnil(arrayslot(t, i))) {
      setintV(key, i);
      copyTV(L, key+1, arrayslot(t, i));
      return 1;
    }
  for (i -= t->asize; i <= t->hmask; i++) {  /* Then traverse the hash keys. */
    Node *n = &noderef(t->node)[i];
    if (!tvisnil(&n->val)) {
      copyTV(L, key, &n->key);
      copyTV(L, key+1, &n->val);
      return 1;
    }
  }
  return 0;  /* End of traversal. */
}